

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O3

void deTimer_disable(deTimer *timer)

{
  itimerspec local_28;
  
  local_28.it_value.tv_sec = 0;
  local_28.it_value.tv_nsec = 0;
  local_28.it_interval.tv_sec = 0;
  local_28.it_interval.tv_nsec = 0;
  timer_settime(timer->timer,0,&local_28,(itimerspec *)0x0);
  timer->isActive = 0;
  return;
}

Assistant:

void deTimer_disable (deTimer* timer)
{
	struct itimerspec tspec;

	DE_ASSERT(timer);

	tspec.it_value.tv_sec		= 0;
	tspec.it_value.tv_nsec		= 0;
	tspec.it_interval.tv_sec	= 0;
	tspec.it_interval.tv_nsec	= 0;

	timer_settime(timer->timer, 0, &tspec, DE_NULL);

	/* \todo [2012-07-10 pyry] How to wait until all pending callbacks have finished? */

	timer->isActive = DE_FALSE;
}